

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitMemoryCopy(FunctionValidator *this,MemoryCopy *curr)

{
  bool result;
  Module *pMVar1;
  Memory *pMVar2;
  Memory *pMVar3;
  Memory *sourceMemory;
  Memory *destMemory;
  Type local_20;
  MemoryCopy *local_18;
  MemoryCopy *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (MemoryCopy *)this;
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasBulkMemoryOpt(&pMVar1->features);
  shouldBeTrue<wasm::MemoryCopy*>
            (this,result,local_18,
             "memory.copy operations require bulk memory operations [--enable-bulk-memory-opt]");
  local_20.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type
                .id;
  wasm::Type::Type((Type *)&destMemory,none);
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,local_20,(Type)destMemory,local_18,"memory.copy must have type none");
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  pMVar2 = Module::getMemoryOrNull(pMVar1,(Name)(local_18->destMemory).super_IString.str);
  shouldBeTrue<wasm::MemoryCopy*>
            (this,pMVar2 != (Memory *)0x0,local_18,"memory.copy destMemory must exist");
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  pMVar3 = Module::getMemoryOrNull(pMVar1,(Name)(local_18->sourceMemory).super_IString.str);
  shouldBeTrue<wasm::MemoryCopy*>
            (this,pMVar3 != (Memory *)0x0,local_18,"memory.copy sourceMemory must exist");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(local_18->dest->type).id,(Type)(pMVar2->addressType).id,local_18,
             "memory.copy dest must match destMemory index type");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(local_18->source->type).id,(Type)(pMVar3->addressType).id,local_18,
             "memory.copy source must match sourceMemory index type");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(local_18->size->type).id,(Type)(pMVar2->addressType).id,local_18,
             "memory.copy size must match destMemory index type");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(local_18->size->type).id,(Type)(pMVar3->addressType).id,local_18,
             "memory.copy size must match destMemory index type");
  return;
}

Assistant:

void FunctionValidator::visitMemoryCopy(MemoryCopy* curr) {
  shouldBeTrue(getModule()->features.hasBulkMemoryOpt(),
               curr,
               "memory.copy operations require bulk memory operations "
               "[--enable-bulk-memory-opt]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::none), curr, "memory.copy must have type none");
  auto* destMemory = getModule()->getMemoryOrNull(curr->destMemory);
  shouldBeTrue(!!destMemory, curr, "memory.copy destMemory must exist");
  auto* sourceMemory = getModule()->getMemoryOrNull(curr->sourceMemory);
  shouldBeTrue(!!sourceMemory, curr, "memory.copy sourceMemory must exist");
  shouldBeEqualOrFirstIsUnreachable(
    curr->dest->type,
    destMemory->addressType,
    curr,
    "memory.copy dest must match destMemory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->source->type,
    sourceMemory->addressType,
    curr,
    "memory.copy source must match sourceMemory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    destMemory->addressType,
    curr,
    "memory.copy size must match destMemory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    sourceMemory->addressType,
    curr,
    "memory.copy size must match destMemory index type");
}